

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::BrReg1(ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot R1_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x15);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x330,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cbc94;
    *puVar3 = 0;
  }
  CheckLabel(this,labelID);
  R1_00 = ConsumeReg(this,R1);
  bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)0>>(this,op,labelID,R1_00);
  if (!bVar2) {
    bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)1>>(this,op,labelID,R1_00);
    if (!bVar2) {
      bVar2 = TryWriteBrReg1<Js::LayoutSizePolicy<(Js::LayoutSize)2>>(this,op,labelID,R1_00);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x335,"(success)","success");
        if (!bVar2) {
LAB_007cbc94:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::BrReg1(OpCode op, ByteCodeLabel labelID, RegSlot R1)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::BrReg1);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));
        CheckLabel(labelID);

        R1 = ConsumeReg(R1);

        MULTISIZE_LAYOUT_WRITE(BrReg1, op, labelID, R1);
    }